

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

ostream * tcb::operator<<(ostream *os,rational<short> *r)

{
  ostream *this;
  
  std::ostream::operator<<(os,r->num_);
  if (r->denom_ != 1) {
    this = std::operator<<(os,'/');
    std::ostream::operator<<(this,r->denom_);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const rational<T>& r)
{
    os << r.num();
    if (r.denom() != 1) {
        os << '/' << r.denom();
    }
    return os;
}